

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_dc_predictor_64x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i row;
  uint32_t sum;
  __m128i sum_left;
  __m128i sum_above;
  longlong local_d8;
  longlong lStack_d0;
  uint local_bc;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint8_t *local_98;
  ptrdiff_t local_88;
  uint8_t *local_80;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_29;
  longlong local_28;
  longlong lStack_20;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  undefined1 local_8;
  undefined1 local_7;
  undefined1 local_6;
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  
  local_98 = in_RCX;
  local_88 = in_RSI;
  local_80 = in_RDI;
  dc_sum_64(in_RDX);
  local_a8 = extraout_XMM0_Qa;
  uStack_a0 = extraout_XMM0_Qb;
  dc_sum_64(local_98);
  local_68 = local_a8;
  uVar1 = local_68;
  uStack_60 = uStack_a0;
  uVar2 = uStack_60;
  local_68._0_2_ = (short)local_a8;
  local_68._2_2_ = (short)((ulong)local_a8 >> 0x10);
  local_68._4_2_ = (short)((ulong)local_a8 >> 0x20);
  local_68._6_2_ = (short)((ulong)local_a8 >> 0x30);
  uStack_60._0_2_ = (short)uStack_a0;
  uStack_60._2_2_ = (short)((ulong)uStack_a0 >> 0x10);
  uStack_60._4_2_ = (short)((ulong)uStack_a0 >> 0x20);
  uStack_60._6_2_ = (short)((ulong)uStack_a0 >> 0x30);
  local_78 = (short)extraout_XMM0_Qa_00;
  sStack_76 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  sStack_74 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  sStack_72 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  sStack_70 = (short)extraout_XMM0_Qb_00;
  sStack_6e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  sStack_6c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  sStack_6a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  local_a8._0_4_ = CONCAT22(local_68._2_2_ + sStack_76,(short)local_68 + local_78);
  local_a8 = CONCAT26(local_68._6_2_ + sStack_72,CONCAT24(local_68._4_2_ + sStack_74,(int)local_a8))
  ;
  uStack_a0 = CONCAT26(uStack_60._6_2_ + sStack_6a,
                       CONCAT24(uStack_60._4_2_ + sStack_6c,
                                CONCAT22(uStack_60._2_2_ + sStack_6e,(short)uStack_60 + sStack_70)))
  ;
  local_48 = local_a8;
  uStack_40 = uStack_a0;
  local_58 = local_a8;
  uStack_50 = uStack_a0;
  local_bc = (int)local_a8 + 0x40U >> 7;
  local_29 = (undefined1)local_bc;
  local_1 = (undefined1)local_bc;
  local_2 = (undefined1)local_bc;
  local_3 = (undefined1)local_bc;
  local_4 = (undefined1)local_bc;
  local_5 = (undefined1)local_bc;
  local_6 = (undefined1)local_bc;
  local_7 = (undefined1)local_bc;
  local_8 = (undefined1)local_bc;
  local_9 = (undefined1)local_bc;
  local_a = (undefined1)local_bc;
  local_b = (undefined1)local_bc;
  local_c = (undefined1)local_bc;
  local_d = (undefined1)local_bc;
  local_e = (undefined1)local_bc;
  local_f = (undefined1)local_bc;
  local_10 = (undefined1)local_bc;
  local_d8 = CONCAT17((undefined1)local_bc,
                      CONCAT16((undefined1)local_bc,
                               CONCAT15((undefined1)local_bc,
                                        CONCAT14((undefined1)local_bc,
                                                 CONCAT13((undefined1)local_bc,
                                                          CONCAT12((undefined1)local_bc,
                                                                   CONCAT11((undefined1)local_bc,
                                                                            (undefined1)local_bc))))
                                       )));
  lStack_d0 = CONCAT17((undefined1)local_bc,
                       CONCAT16((undefined1)local_bc,
                                CONCAT15((undefined1)local_bc,
                                         CONCAT14((undefined1)local_bc,
                                                  CONCAT13((undefined1)local_bc,
                                                           CONCAT12((undefined1)local_bc,
                                                                    CONCAT11((undefined1)local_bc,
                                                                             (undefined1)local_bc)))
                                                 ))));
  local_68 = uVar1;
  uStack_60 = uVar2;
  local_28 = local_d8;
  lStack_20 = lStack_d0;
  dc_store_64xh((__m128i *)&local_d8,0x40,local_80,local_88);
  return;
}

Assistant:

void aom_dc_predictor_64x64_sse2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  __m128i sum_above = dc_sum_64(above);
  const __m128i sum_left = dc_sum_64(left);
  sum_above = _mm_add_epi16(sum_above, sum_left);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 64;
  sum /= 128;
  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_64xh(&row, 64, dst, stride);
}